

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O3

FilterPropagateResult __thiscall
duckdb::CheckZonemapTemplated<duckdb::hugeint_t>
          (duckdb *this,BaseStatistics *stats,ExpressionType comparison_type,
          array_ptr<duckdb::Value,_true> constants)

{
  int64_t iVar1;
  hugeint_t max_value;
  FilterPropagateResult FVar2;
  Value *this_00;
  Value *pVVar3;
  undefined7 in_register_00000011;
  hugeint_t min_value;
  array_ptr_iterator<duckdb::Value> __begin2;
  array_ptr_iterator<duckdb::Value> local_60;
  uint64_t local_48;
  hugeint_t local_40;
  
  pVVar3 = constants.ptr;
  local_48 = *(uint64_t *)(this + 0x30);
  iVar1 = *(int64_t *)(this + 0x38);
  max_value = *(hugeint_t *)(this + 0x40);
  local_60.index = 0;
  if (pVVar3 != (Value *)0x0) {
    local_60.ptr = (Value *)CONCAT71(in_register_00000011,comparison_type);
    local_60.size = (idx_t)pVVar3;
    do {
      this_00 = array_ptr_iterator<duckdb::Value>::operator*(&local_60);
      local_40 = Value::GetValueUnsafe<duckdb::hugeint_t>(this_00);
      min_value.upper = iVar1;
      min_value.lower = local_48;
      FVar2 = CheckZonemapTemplated<duckdb::hugeint_t>
                        ((BaseStatistics *)this,(ExpressionType)stats,min_value,max_value,local_40);
      if (FVar2 < FILTER_ALWAYS_FALSE) {
        return FVar2;
      }
      local_60.index = (idx_t)&((LogicalType *)local_60.index)->physical_type_;
      if (local_60.size <= local_60.index) {
        local_60.index = local_60.size;
      }
    } while (((local_60.ptr != (Value *)CONCAT71(in_register_00000011,comparison_type)) ||
             ((Value *)local_60.index != pVVar3)) || ((Value *)local_60.size != pVVar3));
  }
  return FILTER_ALWAYS_FALSE;
}

Assistant:

hugeint_t GetNumericValueUnion::Operation(const NumericValueUnion &v) {
	return v.value_.hugeint;
}